

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

string * __thiscall
czh::lexer::Match::error_correct_abi_cxx11_(string *__return_storage_ptr__,Match *this)

{
  allocator<char> local_99;
  source_location local_98;
  allocator<char> local_89;
  string local_88;
  source_location local_68;
  allocator<char> local_59;
  string local_58;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  Match *local_18;
  Match *this_local;
  
  local_18 = this;
  this_local = (Match *)__return_storage_ptr__;
  switch(this->last_state) {
  case INIT:
  case REF:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"identifier",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case ID:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\'=\' or \':\'",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Unexpected token",&local_59);
    local_68._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00277158;
    czh::error::czh_unreachable(&local_58,&local_68);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Unexpected token",&local_89);
    local_98._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00277170;
    czh::error::czh_unreachable(&local_88,&local_98);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_99);
    std::allocator<char>::~allocator(&local_99);
    break;
  case ARR_VALUE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\']\' or \',\'",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case EQUAL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"value or \'[\'",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case ARR_LP:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"value or \']\'",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case COMMA:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"value",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case REF_ID:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\'::\'",&local_32);
    std::allocator<char>::~allocator(&local_32);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string error_correct()
    {
      switch (last_state)
      {
        case State::REF:
        case State::INIT:
          return "identifier";
        case State::ID:
          return "'=' or ':'";
        case State::EQUAL:
          return "value or '['";
        case State::ARR_LP:
          return "value or ']'";
        case State::ARR_VALUE:
          return "']' or ','";
        case State::COMMA:
          return "value";
        case State::REF_ID:
          return "'::'";
        default:
          error::czh_unreachable("Unexpected token");
      }
      error::czh_unreachable("Unexpected token");
      return "";
    }